

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

int __thiscall
Hpipe::Lexer::push_tok(Lexer *this,Source *source,char *beg,char *end,Type type,int grp,char delim)

{
  pointer *pppLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppLVar3;
  Lexem *this_00;
  iterator __position;
  bool bVar4;
  bool bVar5;
  Lexem *pLVar6;
  char *msg;
  Source *source_00;
  ErrorList *this_01;
  bool bVar7;
  Lexem *item;
  string local_88;
  char *local_68;
  Type local_5c;
  string local_58;
  Source *local_38;
  
  bVar7 = delim == ')';
  local_68 = beg;
  local_5c = type;
  local_38 = source;
  if ((delim == ']') || (delim == ')')) {
    ppLVar3 = (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
        _M_impl.super__Vector_impl_data._M_start == ppLVar3) {
      this_01 = this->error_list;
      source_00 = this->last->source;
      msg = "Closing parenthesis without opening correspondance.";
    }
    else {
      pLVar6 = ppLVar3[-1];
      this->last = pLVar6;
      (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppLVar3 + -1;
      if (delim == ')') {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"(","");
        bVar5 = Lexem::eq(pLVar6,&local_88);
        bVar5 = !bVar5;
        bVar7 = true;
        bVar4 = false;
      }
      else if (delim == ']') {
        pLVar6 = this->last;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"[","");
        bVar5 = Lexem::eq(pLVar6,&local_58);
        bVar5 = !bVar5;
        bVar4 = true;
      }
      else {
        bVar7 = false;
        bVar4 = false;
        bVar5 = false;
      }
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2)) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2)) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) goto LAB_0017793c;
      pLVar6 = this->last;
      if (pLVar6 == (Lexem *)0x0) {
        source_00 = (Source *)0x0;
      }
      else {
        source_00 = pLVar6->source;
      }
      this_01 = this->error_list;
      if (pLVar6 == (Lexem *)0x0) {
        beg = (char *)0x0;
      }
      else {
        beg = pLVar6->beg;
      }
      msg = "Non matching parenthesis.";
    }
    ErrorList::add(this_01,source_00,beg,msg);
  }
  else {
    paVar2 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,beg,end);
    pLVar6 = Pool<Hpipe::Lexem,32>::
             New<Hpipe::Lexem::Type&,Hpipe::Source*&,char_const*&,std::__cxx11::string>
                       ((Pool<Hpipe::Lexem,32> *)&this->lexem_pool,&local_5c,&local_38,&local_68,
                        &local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)pLVar6;
    if (this->last == (Lexem *)0x0) {
      this_00 = (this->stack_last).
                super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      local_88._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"[","");
      bVar7 = Lexem::eq(this_00,&local_88);
      this_00->children[bVar7] = pLVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      *(Lexem **)(local_58._M_dataplus._M_p + 0x48) = this_00;
    }
    else {
      this->last->next = pLVar6;
    }
    *(Lexem **)(local_58._M_dataplus._M_p + 0x58) = this->last;
    this->last = (Lexem *)local_58._M_dataplus._M_p;
    if (grp < 0) {
      *(Lexem **)(local_58._M_dataplus._M_p + 0x60) = (Lexem *)0x0;
    }
    else {
      *(Lexem **)(local_58._M_dataplus._M_p + 0x60) = this->sibling[(uint)grp];
      this->sibling[(uint)grp] = (Lexem *)local_58._M_dataplus._M_p;
    }
    if ((delim == '[') || (delim == '(')) {
      __position._M_current =
           (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Hpipe::Lexem*,std::allocator<Hpipe::Lexem*>>::
        _M_realloc_insert<Hpipe::Lexem*const&>
                  ((vector<Hpipe::Lexem*,std::allocator<Hpipe::Lexem*>> *)&this->stack_last,
                   __position,(Lexem **)&local_58);
      }
      else {
        *__position._M_current = (Lexem *)local_58._M_dataplus._M_p;
        pppLVar1 = &(this->stack_last).
                    super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + 1;
      }
      this->last = (Lexem *)0x0;
    }
  }
LAB_0017793c:
  return (int)end - (int)local_68;
}

Assistant:

int Lexer::push_tok( Source *source, const char *beg, const char *end, Lexem::Type type, int grp, char delim ) {
    if ( delim == ')' or delim == ']' ) {
        if ( stack_last.empty() ) {
            error_list.add( last->source, beg, "Closing parenthesis without opening correspondance." );
            return end - beg;
        }
        last = stack_last.back();
        stack_last.pop_back();
        if ( ( delim == ')' and not last->eq( "(" ) ) or ( delim == ']' and not last->eq( "[" ) ) )
            err( last, "Non matching parenthesis." );
        return end - beg;
    }

    Lexem *item = lexem_pool.New( type, source, beg, std::string{ beg, end } );
    if ( last ) {
        last->next = item;
    } else {
        Lexem *p = stack_last.back();
        p->children[ p->eq( "[" ) ] = item;
        item->parent = p;
    }
    item->prev = last;
    last = item;

    if ( grp >= 0 ) {
        item->sibling = sibling[ grp ];
        sibling[ grp ] = item;
    } else
        item->sibling = 0;

    // PRINT( String( beg, end ), grp, type );
    if ( delim == '(' or delim == '[' ) {
        stack_last.push_back( item );
        last = 0;
    }

    return end - beg;
}